

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::FindNextBlocks
          (PeerManagerImpl *this,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *vBlocks,Peer *peer,
          CNodeState *state,CBlockIndex *pindexWalk,uint count,int nWindowEnd,CChain *activeChain,
          NodeId *nodeStaller)

{
  pointer *pppCVar1;
  int iVar2;
  CBlockIndex *pCVar3;
  pointer ppCVar4;
  uint256 *puVar5;
  _Base_ptr p_Var6;
  iterator __position;
  pointer ppCVar7;
  pointer ppCVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  CBlockIndex *pCVar12;
  long lVar13;
  CBlockIndex *pCVar14;
  size_type sVar15;
  int iVar16;
  int *piVar17;
  _Base_ptr p_Var18;
  long in_FS_OFFSET;
  byte bVar19;
  CBlockIndex *pindex;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToFetch;
  long local_d0;
  CBlockIndex *local_80;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> local_78;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = state->pindexBestKnownBlock->nHeight;
  if (nWindowEnd + 1 < iVar2) {
    iVar2 = nWindowEnd + 1;
  }
  if (((peer->m_their_services)._M_i & NODE_NETWORK) == NODE_NONE) {
    bVar9 = (byte)((peer->m_their_services)._M_i >> 10) & 1;
  }
  else {
    bVar9 = 0;
  }
  iVar10 = pindexWalk->nHeight;
  if (iVar10 < iVar2) {
    piVar17 = &pindexWalk->nHeight;
    local_d0 = -1;
    do {
      iVar16 = count - (int)((ulong)((long)(vBlocks->
                                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(vBlocks->
                                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar16 < 0x81) {
        iVar16 = 0x80;
      }
      if (iVar2 - iVar10 <= iVar16) {
        iVar16 = iVar2 - iVar10;
      }
      std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::resize
                (&local_78,(long)iVar16);
      pCVar12 = CBlockIndex::GetAncestor(state->pindexBestKnownBlock,*piVar17 + iVar16);
      ppCVar8 = local_78.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
      .super__Vector_impl_data._M_start[(long)iVar16 - 1] = pCVar12;
      ppCVar7 = local_78.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (iVar16 - 1U != 0) {
        lVar13 = (ulong)(iVar16 - 1U) << 3;
        do {
          *(undefined8 *)
           ((long)local_78.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar13 + -8) =
               *(undefined8 *)
                (*(long *)((long)local_78.
                                 super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar13) + 8);
          lVar13 = lVar13 + -8;
        } while (lVar13 != 0);
      }
      for (; ppCVar7 != ppCVar8; ppCVar7 = ppCVar7 + 1) {
        pCVar3 = *ppCVar7;
        bVar19 = 1;
        local_80 = pCVar3;
        if (((pCVar3->nStatus & 6) == 0 || (pCVar3->nStatus & 0x60) != 0) ||
           ((((peer->m_their_services)._M_i & NODE_WITNESS) == NODE_NONE &&
            ((((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight <=
             pCVar3->nHeight)))) goto LAB_0091bcfb;
        if ((pCVar3->nStatus & 8) == 0) {
          if (activeChain != (CChain *)0x0) {
            iVar10 = pCVar3->nHeight;
            if (((long)iVar10 < 0) ||
               (ppCVar4 = (activeChain->vChain).
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
               (int)((ulong)((long)(activeChain->vChain).
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3)
               <= iVar10)) {
              pCVar14 = (CBlockIndex *)0x0;
            }
            else {
              pCVar14 = ppCVar4[iVar10];
            }
            if (pCVar14 == pCVar3) goto LAB_0091bcdb;
          }
          puVar5 = pCVar3->phashBlock;
          if (puVar5 == (uint256 *)0x0) {
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
          local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
          local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
          sVar15 = std::
                   multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                   ::count(&this->mapBlocksInFlight,&local_58);
          if (sVar15 != 0) {
            if (local_d0 == -1) {
              local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
              local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
              local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
              local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
              p_Var6 = (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
              p_Var18 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header;
              for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                  p_Var6 = (&p_Var6->_M_left)[uVar11 >> 0x1f]) {
                uVar11 = memcmp(p_Var6 + 1,&local_58,0x20);
                if (-1 < (int)uVar11) {
                  p_Var18 = p_Var6;
                }
              }
              local_d0 = *(long *)(p_Var18 + 2);
            }
            goto LAB_0091bcf6;
          }
          if (nWindowEnd < pCVar3->nHeight) {
            if ((((vBlocks->
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish ==
                  (vBlocks->
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                  _M_impl.super__Vector_impl_data._M_start) && (nodeStaller != (NodeId *)0x0)) &&
               (local_d0 != peer->m_id)) {
              *nodeStaller = local_d0;
            }
          }
          else {
            if ((bVar9 != 0) && (0x11d < state->pindexBestKnownBlock->nHeight - pCVar3->nHeight))
            goto LAB_0091bcf6;
            __position._M_current =
                 (vBlocks->
                 super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (vBlocks->
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
              _M_realloc_insert<CBlockIndex_const*const&>
                        ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)vBlocks,
                         __position,&local_80);
            }
            else {
              *__position._M_current = pCVar3;
              pppCVar1 = &(vBlocks->
                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
            bVar19 = (long)(vBlocks->
                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(vBlocks->
                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)count;
          }
        }
        else {
LAB_0091bcdb:
          if ((activeChain != (CChain *)0x0) && (pCVar3->m_chain_tx_count != 0)) {
            state->pindexLastCommonBlock = pCVar3;
          }
LAB_0091bcf6:
          bVar19 = 8;
        }
LAB_0091bcfb:
        if ((bVar19 & 7) != 0) goto LAB_0091bdf3;
      }
      bVar19 = 7;
LAB_0091bdf3:
      if ((bVar19 != 7) && (bVar19 != 0)) break;
      piVar17 = &pCVar12->nHeight;
      iVar10 = pCVar12->nHeight;
    } while (iVar10 < iVar2);
  }
  if (local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::FindNextBlocks(std::vector<const CBlockIndex*>& vBlocks, const Peer& peer, CNodeState *state, const CBlockIndex *pindexWalk, unsigned int count, int nWindowEnd, const CChain* activeChain, NodeId* nodeStaller)
{
    std::vector<const CBlockIndex*> vToFetch;
    int nMaxHeight = std::min<int>(state->pindexBestKnownBlock->nHeight, nWindowEnd + 1);
    bool is_limited_peer = IsLimitedPeer(peer);
    NodeId waitingfor = -1;
    while (pindexWalk->nHeight < nMaxHeight) {
        // Read up to 128 (or more, if more blocks than that are needed) successors of pindexWalk (towards
        // pindexBestKnownBlock) into vToFetch. We fetch 128, because CBlockIndex::GetAncestor may be as expensive
        // as iterating over ~100 CBlockIndex* entries anyway.
        int nToFetch = std::min(nMaxHeight - pindexWalk->nHeight, std::max<int>(count - vBlocks.size(), 128));
        vToFetch.resize(nToFetch);
        pindexWalk = state->pindexBestKnownBlock->GetAncestor(pindexWalk->nHeight + nToFetch);
        vToFetch[nToFetch - 1] = pindexWalk;
        for (unsigned int i = nToFetch - 1; i > 0; i--) {
            vToFetch[i - 1] = vToFetch[i]->pprev;
        }

        // Iterate over those blocks in vToFetch (in forward direction), adding the ones that
        // are not yet downloaded and not in flight to vBlocks. In the meantime, update
        // pindexLastCommonBlock as long as all ancestors are already downloaded, or if it's
        // already part of our chain (and therefore don't need it even if pruned).
        for (const CBlockIndex* pindex : vToFetch) {
            if (!pindex->IsValid(BLOCK_VALID_TREE)) {
                // We consider the chain that this peer is on invalid.
                return;
            }

            if (!CanServeWitnesses(peer) && DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
                // We wouldn't download this block or its descendants from this peer.
                return;
            }

            if (pindex->nStatus & BLOCK_HAVE_DATA || (activeChain && activeChain->Contains(pindex))) {
                if (activeChain && pindex->HaveNumChainTxs()) {
                    state->pindexLastCommonBlock = pindex;
                }
                continue;
            }

            // Is block in-flight?
            if (IsBlockRequested(pindex->GetBlockHash())) {
                if (waitingfor == -1) {
                    // This is the first already-in-flight block.
                    waitingfor = mapBlocksInFlight.lower_bound(pindex->GetBlockHash())->second.first;
                }
                continue;
            }

            // The block is not already downloaded, and not yet in flight.
            if (pindex->nHeight > nWindowEnd) {
                // We reached the end of the window.
                if (vBlocks.size() == 0 && waitingfor != peer.m_id) {
                    // We aren't able to fetch anything, but we would be if the download window was one larger.
                    if (nodeStaller) *nodeStaller = waitingfor;
                }
                return;
            }

            // Don't request blocks that go further than what limited peers can provide
            if (is_limited_peer && (state->pindexBestKnownBlock->nHeight - pindex->nHeight >= static_cast<int>(NODE_NETWORK_LIMITED_MIN_BLOCKS) - 2 /* two blocks buffer for possible races */)) {
                continue;
            }

            vBlocks.push_back(pindex);
            if (vBlocks.size() == count) {
                return;
            }
        }
    }
}